

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

int32_t __thiscall icu_63::Calendar::getRelatedYear(Calendar *this,UErrorCode *status)

{
  int32_t iVar1;
  int iVar2;
  ECalType EVar3;
  undefined4 extraout_var;
  int32_t iVar4;
  
  iVar4 = 0;
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (iVar1 = get(this,UCAL_EXTENDED_YEAR,status), iVar4 = 0, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    iVar2 = (*(this->super_UObject)._vptr_UObject[0x17])(this);
    EVar3 = getCalendarType((char *)CONCAT44(extraout_var,iVar2));
    iVar4 = iVar1;
    switch(EVar3) {
    case CALTYPE_PERSIAN:
      iVar4 = iVar1 + 0x26e;
      break;
    case CALTYPE_ISLAMIC_CIVIL:
    case CALTYPE_ISLAMIC:
    case CALTYPE_ISLAMIC_UMALQURA:
    case CALTYPE_ISLAMIC_TBLA:
    case CALTYPE_ISLAMIC_RGSA:
      if (iVar1 < 0x575) {
        iVar2 = (((0x574U - iVar1) / 0x43) * 2 - (uint)((0x574U - iVar1) % 0x43 < 0x22)) + 2;
      }
      else {
        iVar2 = (((iVar1 - 0x575U) % 0x43 < 0x21) - 1) + ((iVar1 - 0x575U) / 0x43) * -2;
      }
      iVar4 = iVar1 + iVar2 + 0x243;
      break;
    case CALTYPE_HEBREW:
      iVar4 = iVar1 + -0xeb0;
      break;
    case CALTYPE_CHINESE:
      iVar4 = iVar1 + -0xa4d;
      break;
    case CALTYPE_INDIAN:
      iVar4 = iVar1 + 0x4f;
      break;
    case CALTYPE_COPTIC:
      iVar4 = iVar1 + 0x11c;
      break;
    case CALTYPE_ETHIOPIC:
      iVar4 = iVar1 + 8;
      break;
    case CALTYPE_ETHIOPIC_AMETE_ALEM:
      iVar4 = iVar1 + -0x1574;
      break;
    case CALTYPE_DANGI:
      iVar4 = iVar1 + -0x91d;
    }
  }
  return iVar4;
}

Assistant:

int32_t Calendar::getRelatedYear(UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t year = get(UCAL_EXTENDED_YEAR, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year += 622; break;
        case CALTYPE_HEBREW:
            year -= 3760; break;
        case CALTYPE_CHINESE:
            year -= 2637; break;
        case CALTYPE_INDIAN:
            year += 79; break;
        case CALTYPE_COPTIC:
            year += 284; break;
        case CALTYPE_ETHIOPIC:
            year += 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year -=5492; break;
        case CALTYPE_DANGI:
            year -= 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = gregoYearFromIslamicStart(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    return year;
}